

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::put_u64(buffer_serializer *this,uint64_t val)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  overflow_error *this_00;
  byte *pbVar9;
  buffer_serializer *in_RSI;
  buffer_serializer *in_RDI;
  uint8_t *ptr;
  buffer_serializer *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe8;
  
  bVar8 = is_valid(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  if (!bVar8) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar9 = nuraft::buffer::data_begin(in_RDI->buf_);
  pbVar9 = pbVar9 + in_RDI->pos_;
  bVar1 = (byte)((ulong)in_RSI >> 8);
  bVar2 = (byte)((ulong)in_RSI >> 0x10);
  bVar3 = (byte)((ulong)in_RSI >> 0x18);
  bVar4 = (byte)((ulong)in_RSI >> 0x20);
  bVar5 = (byte)((ulong)in_RSI >> 0x28);
  bVar6 = (byte)((ulong)in_RSI >> 0x30);
  bVar7 = (byte)((ulong)in_RSI >> 0x38);
  if (in_RDI->endian_ == LITTLE) {
    *pbVar9 = (byte)in_RSI;
    pbVar9[1] = bVar1;
    pbVar9[2] = bVar2;
    pbVar9[3] = bVar3;
    pbVar9[4] = bVar4;
    pbVar9[5] = bVar5;
    pbVar9[6] = bVar6;
    pbVar9[7] = bVar7;
  }
  else {
    pbVar9[7] = (byte)in_RSI;
    pbVar9[6] = bVar1;
    pbVar9[5] = bVar2;
    pbVar9[4] = bVar3;
    pbVar9[3] = bVar4;
    pbVar9[2] = bVar5;
    pbVar9[1] = bVar6;
    *pbVar9 = bVar7;
  }
  pos(in_RDI);
  pos(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void buffer_serializer::put_u64(uint64_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put64l(val, ptr); }
    else                    { put64b(val, ptr); }
    pos( pos() + sizeof(val) );
}